

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O2

void __thiscall phoenix_evsa_t::evsa_body_t::_read(evsa_body_t *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  bool bVar1;
  uint8_t uVar2;
  pointer __p;
  pointer __p_00;
  evsa_entry_t *this_01;
  pointer __p_01;
  uint uVar3;
  pointer *__ptr;
  _Head_base<0UL,_std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_*,_false>
  local_38;
  
  __p_00 = (pointer)operator_new(0x18);
  (__p_00->
  super__Vector_base<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->
  super__Vector_base<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->
  super__Vector_base<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_head_impl =
       (vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
        *)0x0;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
           *)&this->m_entries,__p_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
                 *)&local_38);
  do {
    this_01 = (evsa_entry_t *)operator_new(0x30);
    evsa_entry_t::evsa_entry_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    local_38._M_head_impl =
         (vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
          *)this_01;
    std::
    vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>
    ::
    emplace_back<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>
              ((vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>
                *)(this->m_entries)._M_t.
                  super___uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_*,_false>
                  ._M_head_impl,
               (unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>
                *)&local_38);
    if ((evsa_entry_t *)local_38._M_head_impl != (evsa_entry_t *)0x0) {
      (*(code *)((local_38._M_head_impl)->
                super__Vector_base<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                super___uniq_ptr_impl<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>
                ._M_t)();
    }
    uVar3 = this_01->m_entry_type - 0xe1;
  } while ((((uVar3 < 0xf) && ((0x7007U >> (uVar3 & 0x1f) & 1) != 0)) ||
           (this_01->m_entry_type == 0x83)) &&
          (bVar1 = kaitai::kstream::is_eof((this->super_kstruct).m__io), !bVar1));
  __p_01 = (pointer)operator_new(0x18);
  (__p_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_head_impl =
       (vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
        *)0x0;
  std::
  __uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)&this->m_free_space,__p_01);
  std::
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&local_38);
  while (bVar1 = kaitai::kstream::is_eof((this->super_kstruct).m__io), !bVar1) {
    this_00 = (this->m_free_space)._M_t.
              super___uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>
              ._M_head_impl;
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    local_38._M_head_impl._0_1_ = uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)&local_38);
  }
  return;
}

Assistant:

void phoenix_evsa_t::evsa_body_t::_read() {
    m_entries = std::unique_ptr<std::vector<std::unique_ptr<evsa_entry_t>>>(new std::vector<std::unique_ptr<evsa_entry_t>>());
    {
        int i = 0;
        evsa_entry_t* _;
        do {
            _ = new evsa_entry_t(m__io, this, m__root);
            m_entries->push_back(std::move(std::unique_ptr<evsa_entry_t>(_)));
            i++;
        } while (!( (( ((_->entry_type() != 237) && (_->entry_type() != 238) && (_->entry_type() != 239) && (_->entry_type() != 225) && (_->entry_type() != 226) && (_->entry_type() != 227) && (_->entry_type() != 131)) ) || (_io()->is_eof())) ));
    }
    m_free_space = std::unique_ptr<std::vector<uint8_t>>(new std::vector<uint8_t>());
    {
        int i = 0;
        while (!m__io->is_eof()) {
            m_free_space->push_back(std::move(m__io->read_u1()));
            i++;
        }
    }
}